

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O2

void __thiscall TPZPostProcAnalysis::TransferSolution(TPZPostProcAnalysis *this)

{
  TPZCompMesh *this_00;
  TPZCompMesh *pTVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  TPZFMatrix<double> *this_01;
  TPZFMatrix<double> *pTVar4;
  TPZCompEl *this_02;
  TPZGeoEl *pTVar5;
  double *pdVar6;
  long lVar7;
  long iel;
  long lVar8;
  int64_t isol;
  long col;
  double extraout_XMM0_Qa;
  
  TPZLinearAnalysis::AssembleResidual(&this->super_TPZLinearAnalysis);
  TPZSolutionMatrix::operator=
            (&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution,
             &(this->super_TPZLinearAnalysis).fRhs);
  TPZAnalysis::LoadSolution((TPZAnalysis *)this);
  this_00 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
  if (this_00 == (TPZCompMesh *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
               ,0x143);
  }
  pTVar1 = this->fpMainMesh;
  TPZGeoMesh::ResetReference(pTVar1->fReference);
  TPZCompMesh::LoadReferences(this->fpMainMesh);
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&this_00->fElementSolution);
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar1->fElementSolution);
  lVar8 = ((pTVar1->fElementSolution).fBaseMatrix)->fCol;
  lVar7 = (this_00->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  pTVar2 = (this_00->fElementSolution).fBaseMatrix;
  if (pTVar2 != (TPZBaseMatrix *)0x0) {
    (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar2,lVar7,lVar8);
  }
  if (lVar8 != 0) {
    iel = 0;
    if (lVar8 < 1) {
      lVar8 = iel;
    }
    if (lVar7 < 1) {
      lVar7 = iel;
    }
    for (; iel != lVar7; iel = iel + 1) {
      this_02 = TPZCompMesh::Element(this_00,iel);
      pTVar5 = TPZCompEl::Reference(this_02);
      if (pTVar5 == (TPZGeoEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
                   ,0x158);
      }
      if (pTVar5->fReference == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzpostprocanalysis.cpp"
                   ,0x15b);
      }
      iVar3 = pTVar5->fReference->fIndex;
      for (col = 0; lVar8 != col; col = col + 1) {
        (*(pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x21])(pTVar4,iVar3,col);
        pdVar6 = TPZFMatrix<double>::operator()(this_01,iel,col);
        *pdVar6 = extraout_XMM0_Qa;
      }
    }
  }
  return;
}

Assistant:

void TPZPostProcAnalysis::TransferSolution()
{

    // this is where we compute the projection of the post processed variables
    TPZLinearAnalysis::AssembleResidual();
    fSolution = Rhs();
    TPZLinearAnalysis::LoadSolution();
    
    TPZCompMesh *compmeshPostProcess = (Mesh());
    if (!compmeshPostProcess) {
        DebugStop();
    }
    // fpMainMesh is the mesh with the actual finite element approximation, but probably stored at
    // integration points
    TPZCompMesh *solmesh = fpMainMesh;
    fpMainMesh->Reference()->ResetReference();
    fpMainMesh->LoadReferences();
    //In case the post processing computed element solutions
    // copy the values from the post processing mesh to the finite element mesh
    TPZFMatrix<STATE> &comprefElSol = compmeshPostProcess->ElementSolution();
    // solmesh if the finite element simulation mesh
    const TPZFMatrix<STATE> &solmeshElSol = solmesh->ElementSolution();
    int64_t numelsol = solmesh->ElementSolution().Cols();
    int64_t nelem = compmeshPostProcess->NElements();
    compmeshPostProcess->ElementSolution().Redim(nelem, numelsol);
    if (numelsol) 
    {
        for (int64_t el=0; el<nelem; el++) {
            TPZCompEl *celpost = compmeshPostProcess->Element(el);
            TPZGeoEl *gel = celpost->Reference();
            // we dont acount for condensed elements submeshes etc
            if(!gel) DebugStop();
            TPZCompEl *cel = gel->Reference();
            if (!cel) {
                DebugStop();
            }
            int64_t index = cel->Index();
            // we copy from the simulation mesh to the post processing mesh
            for (int64_t isol=0; isol<numelsol; isol++) {
                comprefElSol(el,isol) = solmeshElSol.Get(index,isol);
            }
        }
    }
}